

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_regexp_Symbol_split(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int64_t iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  JSValueUnion JVar5;
  ulong uVar6;
  uint end;
  long lVar7;
  int64_t iVar8;
  uint uVar9;
  ulong uVar10;
  ulong unaff_R14;
  ulong uVar11;
  long idx;
  JSValue JVar12;
  JSValue func_obj;
  JSValue JVar13;
  JSValue str2;
  JSValue r;
  JSValue JVar14;
  JSValue val;
  JSValue JVar15;
  ulong local_f8;
  int64_t local_d0;
  int64_t local_c8;
  uint32_t lim;
  int64_t e;
  long local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  int64_t numberOfCaptures;
  JSValueUnion local_58;
  int64_t local_50;
  JSValueUnion local_48;
  int64_t local_40;
  JSValueUnion p;
  
  if ((int)this_val.tag != -1) {
    JS_ThrowTypeErrorNotAnObject(ctx);
    iVar8 = 6;
    JVar5.float64 = 0.0;
    goto LAB_00137954;
  }
  JVar12 = JS_ToString(ctx,*argv);
  JVar5 = JVar12.u;
  iVar8 = 3;
  local_f8 = unaff_R14;
  if ((int)JVar12.tag == 6) {
    JVar13 = (JSValue)(ZEXT816(3) << 0x40);
    str2 = (JSValue)(ZEXT816(3) << 0x40);
    uVar9 = 0;
    uVar10 = 0;
    r = (JSValue)(ZEXT816(3) << 0x40);
    func_obj = (JSValue)(ZEXT816(3) << 0x40);
LAB_001378c8:
    local_c8 = str2.tag;
    JVar14.u.ptr = (void *)((ulong)uVar9 | uVar10 << 0x20);
    JVar14.tag = iVar8;
    JS_FreeValue(ctx,JVar14);
    str2.tag = local_c8;
    str2.u.ptr = (void *)((ulong)str2.u.ptr & 0xffffffff | local_f8 << 0x20);
    JVar14 = (JSValue)(ZEXT816(6) << 0x40);
    uVar10 = 0;
  }
  else {
    func_obj = JS_SpeciesConstructor(ctx,this_val,ctx->regexp_ctor);
    if ((int)func_obj.tag == 6) {
      JVar13 = (JSValue)(ZEXT816(3) << 0x40);
      iVar8 = 3;
      str2 = (JSValue)(ZEXT816(3) << 0x40);
      uVar9 = 0;
      uVar10 = 0;
      r = (JSValue)(ZEXT816(3) << 0x40);
      goto LAB_001378c8;
    }
    JVar13 = JS_GetPropertyInternal(ctx,this_val,0x6d,this_val,0);
    str2 = JS_ToStringFree(ctx,JVar13);
    p = str2.u;
    local_f8 = (ulong)p.ptr >> 0x20;
    if ((int)str2.tag == 6) {
LAB_001377c8:
      JVar14 = (JSValue)(ZEXT816(3) << 0x40);
      uVar10 = 0;
      r = (JSValue)(ZEXT816(3) << 0x40);
LAB_001378be:
      JVar13 = (JSValue)(ZEXT816(3) << 0x40);
      iVar8 = JVar14.tag;
      uVar9 = JVar14.u._0_4_;
      goto LAB_001378c8;
    }
    uVar2 = string_indexof_char((JSString *)p.ptr,0x75,0);
    iVar3 = string_indexof_char((JSString *)p.ptr,0x79,0);
    if (iVar3 < 0) {
      str2 = JS_ConcatString3(ctx,"",str2,"y");
      local_f8 = (ulong)str2.u.ptr >> 0x20;
      if ((int)str2.tag == 6) goto LAB_001377c8;
    }
    local_c8 = str2.tag;
    local_48 = str2.u;
    local_40 = local_c8;
    local_58 = this_val.u;
    local_50 = this_val.tag;
    r = JS_CallConstructor(ctx,func_obj,2,(JSValue *)&local_58);
    if ((int)r.tag == 6) {
      JVar14 = (JSValue)(ZEXT816(3) << 0x40);
      uVar10 = 0;
      goto LAB_001378be;
    }
    JVar14 = JS_NewArray(ctx);
    iVar8 = JVar14.tag;
    uVar10 = (ulong)JVar14.u.ptr >> 0x20;
    if ((int)JVar14.tag == 6) goto LAB_001378be;
    uVar9 = JVar14.u._0_4_;
    if ((int)argv[1].tag == 3) {
      lim = 0xffffffff;
LAB_001379b6:
      uVar4 = (uint)*(ulong *)((long)JVar5.ptr + 4);
      end = uVar4 & 0x7fffffff;
      if ((*(ulong *)((long)JVar5.ptr + 4) & 0x7fffffff) != 0) {
        local_70 = (ulong)(uVar4 & 0x7fffffff);
        local_78 = (ulong)lim;
        local_80 = -local_78;
        local_d0 = 0;
        uVar6 = 0;
        JVar13 = (JSValue)(ZEXT816(3) << 0x40);
LAB_00137a19:
        uVar4 = (uint)uVar6;
        local_68 = uVar6;
        do {
          if (end <= (uint)uVar6) goto LAB_00137d06;
          JVar15.u = uVar6 & 0xffffffff;
          JVar15.tag = 0;
          iVar3 = JS_SetProperty(ctx,r,0x55,JVar15);
          if (iVar3 < 0) goto LAB_001378c8;
          JS_FreeValue(ctx,JVar13);
          JVar13 = JS_RegExpExec(ctx,r,JVar12);
          if ((int)JVar13.tag != 2) {
            if ((int)JVar13.tag == 6) goto LAB_001378c8;
            val = JS_GetPropertyInternal(ctx,r,0x55,r,0);
            iVar3 = JS_ToLengthFree(ctx,&e,val);
            if (iVar3 != 0) goto LAB_001378c8;
            uVar11 = e;
            if ((long)local_70 <= e) {
              uVar11 = local_70;
            }
            e = uVar11;
            if (uVar11 != local_68) goto LAB_00137b30;
          }
          uVar6 = string_advance_index((JSString *)JVar5.ptr,JVar15.u,~uVar2 >> 0x1f);
        } while( true );
      }
      JVar13 = JS_RegExpExec(ctx,r,JVar12);
      if ((int)JVar13.tag == 2) {
        local_d0 = 0;
        uVar4 = 0;
LAB_00137d06:
        if (end <= uVar4) {
          uVar4 = end;
        }
        JVar15 = js_sub_string(ctx,(JSString *)JVar5.ptr,uVar4,end);
        if (((int)JVar15.tag == 6) ||
           (iVar3 = JS_DefinePropertyValueInt64(ctx,JVar14,local_d0,JVar15,0x4007), iVar3 < 0))
        goto LAB_001378c8;
      }
      else if ((int)JVar13.tag == 6) goto LAB_001378c8;
    }
    else {
      JVar13.tag = argv[1].tag;
      JVar13.u.ptr = argv[1].u.ptr;
      iVar3 = JS_ToInt32(ctx,(int32_t *)&lim,JVar13);
      if (iVar3 < 0) {
        JVar13 = (JSValue)(ZEXT816(3) << 0x40);
        goto LAB_001378c8;
      }
      if (lim != 0) goto LAB_001379b6;
      JVar13 = (JSValue)(ZEXT816(3) << 0x40);
    }
  }
LAB_001378ee:
  iVar8 = JVar14.tag;
  JS_FreeValue(ctx,JVar12);
  JS_FreeValue(ctx,func_obj);
  JS_FreeValue(ctx,r);
  JS_FreeValue(ctx,str2);
  JS_FreeValue(ctx,JVar13);
  JVar5.ptr = (void *)((ulong)JVar14.u.ptr & 0xffffffff | uVar10 << 0x20);
LAB_00137954:
  JVar12.tag = iVar8;
  JVar12.u.ptr = JVar5.ptr;
  return JVar12;
LAB_00137b30:
  JVar15 = js_sub_string(ctx,(JSString *)JVar5.ptr,uVar4,(uint)uVar6);
  if (((int)JVar15.tag == 6) ||
     (iVar3 = JS_DefinePropertyValueInt64(ctx,JVar14,local_d0,JVar15,0x4007), iVar3 < 0))
  goto LAB_001378c8;
  if (local_d0 + 1U == local_78) goto LAB_001378ee;
  iVar3 = js_get_length64(ctx,&numberOfCaptures,JVar13);
  iVar1 = numberOfCaptures;
  if (iVar3 != 0) goto LAB_001378c8;
  lVar7 = local_80 + local_d0;
  idx = 1;
  while (idx < iVar1) {
    JVar15 = JS_GetPropertyInt64(ctx,JVar13,idx);
    JVar15 = JS_ToStringFree(ctx,JVar15);
    if (((int)JVar15.tag == 6) ||
       (iVar3 = JS_DefinePropertyValueInt64(ctx,JVar14,local_d0 + idx,JVar15,0x4007), iVar3 < 0))
    goto LAB_001378c8;
    idx = idx + 1;
    if (lVar7 + idx == 0) goto LAB_001378ee;
  }
  uVar6 = uVar11 & 0xffffffff;
  local_d0 = local_d0 + idx;
  goto LAB_00137a19;
}

Assistant:

static JSValue js_regexp_Symbol_split(JSContext *ctx, JSValueConst this_val,
                                       int argc, JSValueConst *argv)
{
    // [Symbol.split](str, limit)
    JSValueConst rx = this_val;
    JSValueConst args[2];
    JSValue str, ctor, splitter, A, flags, z, sub;
    JSString *strp;
    uint32_t lim, size, p, q;
    int unicodeMatching;
    int64_t lengthA, e, numberOfCaptures, i;

    if (!JS_IsObject(rx))
        return JS_ThrowTypeErrorNotAnObject(ctx);

    ctor = JS_UNDEFINED;
    splitter = JS_UNDEFINED;
    A = JS_UNDEFINED;
    flags = JS_UNDEFINED;
    z = JS_UNDEFINED;
    str = JS_ToString(ctx, argv[0]);
    if (JS_IsException(str))
        goto exception;
    ctor = JS_SpeciesConstructor(ctx, rx, ctx->regexp_ctor);
    if (JS_IsException(ctor))
        goto exception;
    flags = JS_ToStringFree(ctx, JS_GetProperty(ctx, rx, JS_ATOM_flags));
    if (JS_IsException(flags))
        goto exception;
    strp = JS_VALUE_GET_STRING(flags);
    unicodeMatching = string_indexof_char(strp, 'u', 0) >= 0;
    if (string_indexof_char(strp, 'y', 0) < 0) {
        flags = JS_ConcatString3(ctx, "", flags, "y");
        if (JS_IsException(flags))
            goto exception;
    }
    args[0] = rx;
    args[1] = flags;
    splitter = JS_CallConstructor(ctx, ctor, 2, args);
    if (JS_IsException(splitter))
        goto exception;
    A = JS_NewArray(ctx);
    if (JS_IsException(A))
        goto exception;
    lengthA = 0;
    if (JS_IsUndefined(argv[1])) {
        lim = 0xffffffff;
    } else {
        if (JS_ToUint32(ctx, &lim, argv[1]) < 0)
            goto exception;
        if (lim == 0)
            goto done;
    }
    strp = JS_VALUE_GET_STRING(str);
    p = q = 0;
    size = strp->len;
    if (size == 0) {
        z = JS_RegExpExec(ctx, splitter, str);
        if (JS_IsException(z))
            goto exception;
        if (JS_IsNull(z))
            goto add_tail;
        goto done;
    }
    while (q < size) {
        if (JS_SetProperty(ctx, splitter, JS_ATOM_lastIndex, JS_NewInt32(ctx, q)) < 0)
            goto exception;
        JS_FreeValue(ctx, z);    
        z = JS_RegExpExec(ctx, splitter, str);
        if (JS_IsException(z))
            goto exception;
        if (JS_IsNull(z)) {
            q = string_advance_index(strp, q, unicodeMatching);
        } else {
            if (JS_ToLengthFree(ctx, &e, JS_GetProperty(ctx, splitter, JS_ATOM_lastIndex)))
                goto exception;
            if (e > size)
                e = size;
            if (e == p) {
                q = string_advance_index(strp, q, unicodeMatching);
            } else {
                sub = js_sub_string(ctx, strp, p, q);
                if (JS_IsException(sub))
                    goto exception;
                if (JS_DefinePropertyValueInt64(ctx, A, lengthA++, sub,
                                                JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                    goto exception;
                if (lengthA == lim)
                    goto done;
                p = e;
                if (js_get_length64(ctx, &numberOfCaptures, z))
                    goto exception;
                for(i = 1; i < numberOfCaptures; i++) {
                    sub = JS_ToStringFree(ctx, JS_GetPropertyInt64(ctx, z, i));
                    if (JS_IsException(sub))
                        goto exception;
                    if (JS_DefinePropertyValueInt64(ctx, A, lengthA++, sub, JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                        goto exception;
                    if (lengthA == lim)
                        goto done;
                }
                q = p;
            }
        }
    }
add_tail:
    if (p > size)
        p = size;
    sub = js_sub_string(ctx, strp, p, size);
    if (JS_IsException(sub))
        goto exception;
    if (JS_DefinePropertyValueInt64(ctx, A, lengthA++, sub, JS_PROP_C_W_E | JS_PROP_THROW) < 0)
        goto exception;
    goto done;
exception:
    JS_FreeValue(ctx, A);
    A = JS_EXCEPTION;
done:
    JS_FreeValue(ctx, str);
    JS_FreeValue(ctx, ctor);
    JS_FreeValue(ctx, splitter);
    JS_FreeValue(ctx, flags);
    JS_FreeValue(ctx, z);    
    return A;
}